

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getDoubleOptionValues
                   (void *highs,char *option,double *current_value,double *min_value,
                   double *max_value,double *default_value)

{
  HighsStatus HVar1;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,option,&local_51);
  HVar1 = Highs::getDoubleOptionValues
                    ((Highs *)highs,&local_50,current_value,min_value,max_value,default_value);
  std::__cxx11::string::~string((string *)&local_50);
  return HVar1;
}

Assistant:

HighsInt Highs_getDoubleOptionValues(const void* highs, const char* option,
                                     double* current_value, double* min_value,
                                     double* max_value, double* default_value) {
  return (HighsInt)((Highs*)highs)
      ->getDoubleOptionValues(std::string(option), current_value, min_value,
                              max_value, default_value);
}